

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupMemoryLeakWarningTest::~TEST_GROUP_CppUTestGroupMemoryLeakWarningTest
          (TEST_GROUP_CppUTestGroupMemoryLeakWarningTest *this)

{
  ~TEST_GROUP_CppUTestGroupMemoryLeakWarningTest(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_GROUP(MemoryLeakWarningTest)
{
    DummyMemoryLeakFailure dummy;
    TestTestingFixture* fixture;

    void setup() _override
    {
        fixture = new TestTestingFixture();
        detector = new MemoryLeakDetector(&dummy);
        allocator = new TestMemoryAllocator;
        memPlugin = new MemoryLeakWarningPlugin("TestMemoryLeakWarningPlugin", detector);
        fixture->installPlugin(memPlugin);
        memPlugin->enable();

        leak1 = NULLPTR;
        leak2 = NULLPTR;
    }

    void teardown() _override
    {
        detector->deallocMemory(allocator, leak1);
        detector->deallocMemory(allocator, leak2);

        delete fixture;
        delete memPlugin;
        delete detector;
        delete allocator;
    }
}